

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::NetParameter::Clear(NetParameter *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *pLVar2;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  NetParameter *local_50;
  NetParameter *this_local;
  InternalMetadataWithArena *local_40;
  InternalMetadataWithArena *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_50 = this;
  google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::Clear(&this->layers_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->input_);
  google::protobuf::RepeatedField<int>::Clear(&this->input_dim_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::Clear(&this->input_shape_);
  google::protobuf::RepeatedPtrField<caffe::LayerParameter>::Clear(&this->layer_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 3) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->name_,default_value);
      local_89 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x176d);
        local_89 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_9d,pLVar2);
      }
      if ((local_89 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_88);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_state(this);
    if (bVar1) {
      local_d9 = 0;
      if (this->state_ == (NetState *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1771);
        local_d9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_d8,"CHECK failed: state_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_da,pLVar2);
      }
      if ((local_d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
      }
      NetState::Clear(this->state_);
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xc) != 0) {
    memset(&this->force_backward_,0,2);
  }
  this_local = (NetParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_40 = &this->_internal_metadata_;
  if (((uint)(local_40->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_38 = local_40;
    local_10 = local_40;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_40);
  }
  return;
}

Assistant:

void NetParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.NetParameter)
  layers_.Clear();
  input_.Clear();
  input_dim_.Clear();
  input_shape_.Clear();
  layer_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_state()) {
      GOOGLE_DCHECK(state_ != NULL);
      state_->::caffe::NetState::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 12u) {
    ::memset(&force_backward_, 0, reinterpret_cast<char*>(&debug_info_) -
      reinterpret_cast<char*>(&force_backward_) + sizeof(debug_info_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}